

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,format_object_base *Fmt)

{
  uint uVar1;
  size_t __n;
  char *N;
  char *pcVar2;
  bool bVar3;
  SmallVector<char,_128U> V;
  
  pcVar2 = this->OutBufEnd + -(long)this->OutBufCur;
  if (pcVar2 < (char *)0x4) {
    N = (char *)0x7f;
  }
  else {
    uVar1 = format_object_base::print(Fmt,this->OutBufCur,(uint)pcVar2);
    N = (char *)(ulong)uVar1;
    if (N <= pcVar2) {
      this->OutBufCur = this->OutBufCur + (long)N;
      return this;
    }
  }
  V.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX =
       &V.super_SmallVectorStorage<char,_128U>;
  __n = 0x8000000000;
  V.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = 0;
  V.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity = 0x80;
  do {
    SmallVectorImpl<char>::resize(&V.super_SmallVectorImpl<char>,(size_type)N);
    uVar1 = format_object_base::print
                      (Fmt,(char *)V.super_SmallVectorImpl<char>.
                                   super_SmallVectorTemplateBase<char,_true>.
                                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase
                                   .BeginX,(uint)N);
    pcVar2 = (char *)(ulong)uVar1;
    bVar3 = N < pcVar2;
    N = pcVar2;
  } while (bVar3);
  write(this,(int)V.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,pcVar2,
        __n);
  SmallVectorImpl<char>::~SmallVectorImpl(&V.super_SmallVectorImpl<char>);
  return this;
}

Assistant:

raw_ostream &raw_ostream::operator<<(const format_object_base &Fmt) {
  // If we have more than a few bytes left in our output buffer, try
  // formatting directly onto its end.
  size_t NextBufferSize = 127;
  size_t BufferBytesLeft = OutBufEnd - OutBufCur;
  if (BufferBytesLeft > 3) {
    size_t BytesUsed = Fmt.print(OutBufCur, BufferBytesLeft);

    // Common case is that we have plenty of space.
    if (BytesUsed <= BufferBytesLeft) {
      OutBufCur += BytesUsed;
      return *this;
    }

    // Otherwise, we overflowed and the return value tells us the size to try
    // again with.
    NextBufferSize = BytesUsed;
  }

  // If we got here, we didn't have enough space in the output buffer for the
  // string.  Try printing into a SmallVector that is resized to have enough
  // space.  Iterate until we win.
  SmallVector<char, 128> V;

  while (true) {
    V.resize(NextBufferSize);

    // Try formatting into the SmallVector.
    size_t BytesUsed = Fmt.print(V.data(), NextBufferSize);

    // If BytesUsed fit into the vector, we win.
    if (BytesUsed <= NextBufferSize)
      return write(V.data(), BytesUsed);

    // Otherwise, try again with a new size.
    assert(BytesUsed > NextBufferSize && "Didn't grow buffer!?");
    NextBufferSize = BytesUsed;
  }
}